

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

double sb_stdnan(int sign)

{
  undefined4 uStack_14;
  U rv;
  int sign_local;
  
  uStack_14 = 0x7ff80000;
  if (sign != 0) {
    uStack_14 = 0xfff80000;
  }
  return (double)((ulong)uStack_14 << 0x20);
}

Assistant:

double
sb_stdnan(int sign)
{
    U rv;
    word0(&rv) = NAN_WORD0;
    word1(&rv) = NAN_WORD1;
    if (sign)
        word0(&rv) |= Sign_bit;
    return dval(&rv);
}